

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# genData.hpp
# Opt level: O0

pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_> *
genPointPair<float>(pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>
                    *__return_storage_ptr__,Matrix<float,_4,_4,_0,_4,_4> *T)

{
  Homogeneous<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_0> local_a0;
  pair<Eigen::Homogeneous<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_0>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>
  local_98;
  Homogeneous<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_0> local_70;
  Product<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_Eigen::Homogeneous<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_0>,_0>
  local_68;
  undefined1 local_58 [8];
  Matrix<float,_4,_1,_0,_4,_1> Q;
  int local_3c;
  RandomReturnType local_37;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<float>,_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
  local_34;
  Matrix<float,3,1,0,3,1> local_24 [8];
  Matrix<float,_3,_1,_0,_3,_1> P;
  Matrix<float,_4,_4,_0,_4,_4> *T_local;
  
  P.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array._4_8_ = T;
  Eigen::DenseBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::Random(&local_37,3);
  local_3c = 0x28;
  Eigen::
  MatrixBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<float>,Eigen::Matrix<float,3,1,0,3,1>>>
  ::operator*(&local_34,
              (MatrixBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<float>,Eigen::Matrix<float,3,1,0,3,1>>>
               *)&local_37,&local_3c);
  Eigen::Matrix<float,3,1,0,3,1>::
  Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,float>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<float>,Eigen::Matrix<float,3,1,0,3,1>>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,3,1,0,3,1>const>const>>
            (local_24,(EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<float>,_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>_>
                       *)&local_34);
  local_70.m_matrix =
       (Nested)Eigen::MatrixBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::homogeneous
                         ((MatrixBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)local_24);
  local_68 = Eigen::operator*((MatrixBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_> *)T,&local_70);
  Eigen::Matrix<float,4,1,0,4,1>::
  Matrix<Eigen::Product<Eigen::Matrix<float,4,4,0,4,4>,Eigen::Homogeneous<Eigen::Matrix<float,3,1,0,3,1>,0>,0>>
            ((Matrix<float,4,1,0,4,1> *)local_58,
             (EigenBase<Eigen::Product<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_Eigen::Homogeneous<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_0>,_0>_>
              *)&local_68);
  local_a0.m_matrix =
       (Nested)Eigen::MatrixBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::homogeneous
                         ((MatrixBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)local_24);
  std::
  make_pair<Eigen::Homogeneous<Eigen::Matrix<float,3,1,0,3,1>,0>,Eigen::Matrix<float,4,1,0,4,1>&>
            (&local_98,&local_a0,(Matrix<float,_4,_1,_0,_4,_1> *)local_58);
  std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>::
  pair<Eigen::Homogeneous<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_0>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>,_true>
            (__return_storage_ptr__,&local_98);
  return __return_storage_ptr__;
}

Assistant:

std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>> genPointPair(Eigen::Matrix<floatPrec,4,4> T){
    
    // get a random 3D point (in homogenous coordinates)
    Eigen::Matrix<floatPrec,3,1> P = Eigen::Matrix<floatPrec, 3, 1>::Random(3) * int(POINTSWITHINCUBE);
    // requires as input the pose between the two 3D scans,
    // to apply the respective transformation to the
    // point in RefB
    
    Eigen::Matrix<floatPrec,4,1> Q = T * P.homogeneous();

    return std::make_pair(P.homogeneous(),Q);
}